

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

void ImPlot::RenderGridLinesX
               (ImDrawList *DrawList,ImPlotTickCollection *ticks,ImRect *rect,ImU32 col_maj,
               ImU32 col_min,float size_maj,float size_min)

{
  ImPlotTick *pIVar1;
  ImU32 col;
  long lVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImVec4 IVar7;
  ImVec4 col_min4;
  ImVec2 local_60;
  ImVec2 local_58;
  ImU32 local_50;
  float local_4c;
  ImU32 local_48;
  float local_44;
  undefined1 local_40 [12];
  float fStack_34;
  
  fVar5 = (float)ticks->Size / ((rect->Max).x - (rect->Min).x);
  local_4c = size_min;
  local_48 = col_maj;
  local_44 = size_maj;
  IVar7 = ImGui::ColorConvertU32ToFloat4(col_min);
  fVar6 = (fVar5 + -0.1) / -0.1 + 1.0;
  fVar4 = 1.0;
  if (fVar6 <= 1.0) {
    fVar4 = fVar6;
  }
  fStack_34 = IVar7.w;
  local_40 = IVar7._0_12_;
  fStack_34 = (float)(~-(uint)(fVar6 < 0.0) & (uint)fVar4) * fStack_34;
  local_50 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_40);
  if (0 < ticks->Size) {
    lVar2 = 8;
    lVar3 = 0;
    do {
      if ((ticks->Ticks).Size <= lVar3) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                      ,0x68c,"const T &ImVector<ImPlotTick>::operator[](int) const [T = ImPlotTick]"
                     );
      }
      pIVar1 = (ticks->Ticks).Data;
      if (*(int *)((long)&pIVar1->TextOffset + lVar2) == 0) {
        if (*(char *)((long)&(pIVar1->LabelSize).y + lVar2) == '\x01') {
          local_60.x = *(float *)((long)&pIVar1->PlotPos + lVar2);
          local_60.y = (rect->Min).y;
          local_58.x = *(float *)((long)&pIVar1->PlotPos + lVar2);
          local_58.y = (rect->Max).y;
          fVar4 = local_44;
          col = local_48;
        }
        else {
          if (0.2 <= fVar5) goto LAB_001b4642;
          local_60.x = *(float *)((long)&pIVar1->PlotPos + lVar2);
          local_60.y = (rect->Min).y;
          local_58.x = *(float *)((long)&pIVar1->PlotPos + lVar2);
          local_58.y = (rect->Max).y;
          fVar4 = local_4c;
          col = local_50;
        }
        ImDrawList::AddLine(DrawList,&local_60,&local_58,col,fVar4);
      }
LAB_001b4642:
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (lVar3 < ticks->Size);
  }
  return;
}

Assistant:

static inline void RenderGridLinesX(ImDrawList& DrawList, const ImPlotTickCollection& ticks, const ImRect& rect, ImU32 col_maj, ImU32 col_min, float size_maj, float size_min) {
    const float density   = ticks.Size / rect.GetWidth();
    ImVec4 col_min4  = ImGui::ColorConvertU32ToFloat4(col_min);
    col_min4.w      *= ImClamp(ImRemap(density, 0.1f, 0.2f, 1.0f, 0.0f), 0.0f, 1.0f);
    col_min = ImGui::ColorConvertFloat4ToU32(col_min4);
    for (int t = 0; t < ticks.Size; t++) {
        const ImPlotTick& xt = ticks.Ticks[t];
        if (xt.Level == 0) {
            if (xt.Major)
                DrawList.AddLine(ImVec2(xt.PixelPos, rect.Min.y), ImVec2(xt.PixelPos, rect.Max.y), col_maj, size_maj);
            else if (density < 0.2f)
                DrawList.AddLine(ImVec2(xt.PixelPos, rect.Min.y), ImVec2(xt.PixelPos, rect.Max.y), col_min, size_min);
        }
    }
}